

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidConvolution3DNonPositiveKernelSize(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  WeightParams *pWVar4;
  ostream *poVar5;
  undefined1 local_f8 [8];
  Result res;
  Convolution3DLayerParams *params;
  NeuralNetworkLayer *convLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  int pad_right;
  int pad_left;
  int pad_bottom;
  int pad_top;
  int pad_back;
  int pad_front;
  int dilation_width;
  int dilation_height;
  int dilation_depth;
  int stride_width;
  int stride_height;
  int stride_depth;
  int nGroups;
  int kernel_width;
  int kernel_height;
  int kernel_depth;
  int output_channels;
  int input_channels;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&output_channels);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&output_channels);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  CoreML::Specification::ArrayFeatureType::add_shape(this,3);
  CoreML::Specification::ArrayFeatureType::add_shape(this,0x20);
  CoreML::Specification::ArrayFeatureType::add_shape(this,100);
  CoreML::Specification::ArrayFeatureType::add_shape(this,100);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&output_channels);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"probs");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&output_channels);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_00,EXACT_ARRAY_MAPPING);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  res.m_message._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::NeuralNetworkLayer::mutable_convolution3d(this_01);
  CoreML::Specification::Convolution3DLayerParams::set_inputchannels
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,3);
  CoreML::Specification::Convolution3DLayerParams::set_outputchannels
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,3);
  CoreML::Specification::Convolution3DLayerParams::set_kerneldepth
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,3);
  CoreML::Specification::Convolution3DLayerParams::set_kernelheight
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,0);
  CoreML::Specification::Convolution3DLayerParams::set_kernelwidth
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,3);
  CoreML::Specification::Convolution3DLayerParams::set_ngroups
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,1);
  CoreML::Specification::Convolution3DLayerParams::set_stridedepth
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,1);
  CoreML::Specification::Convolution3DLayerParams::set_strideheight
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,1);
  CoreML::Specification::Convolution3DLayerParams::set_stridewidth
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,1);
  CoreML::Specification::Convolution3DLayerParams::set_dilationdepth
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,1);
  CoreML::Specification::Convolution3DLayerParams::set_dilationheight
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,1);
  CoreML::Specification::Convolution3DLayerParams::set_dilationwidth
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,1);
  CoreML::Specification::Convolution3DLayerParams::set_paddingtype
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,
             Convolution3DLayerParams_PaddingType_CUSTOM);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingfront
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,0);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingback
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,0);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingtop
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,0);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingbottom
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,0);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingleft
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,0);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingright
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,0);
  CoreML::Specification::Convolution3DLayerParams::set_hasbias
            ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage,true);
  for (res.m_message.super__Rb_tree_node_base._M_right._4_4_ = 0;
      res.m_message.super__Rb_tree_node_base._M_right._4_4_ < 0;
      res.m_message.super__Rb_tree_node_base._M_right._4_4_ =
           res.m_message.super__Rb_tree_node_base._M_right._4_4_ + 1) {
    pWVar4 = CoreML::Specification::Convolution3DLayerParams::mutable_weights
                       ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar4,1.0);
  }
  for (res.m_message.super__Rb_tree_node_base._M_right._0_4_ = 0;
      (int)res.m_message.super__Rb_tree_node_base._M_right < 3;
      res.m_message.super__Rb_tree_node_base._M_right._0_4_ =
           (int)res.m_message.super__Rb_tree_node_base._M_right + 1) {
    pWVar4 = CoreML::Specification::Convolution3DLayerParams::mutable_bias
                       ((Convolution3DLayerParams *)res.m_message._M_storage._M_storage);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar4,1.0);
  }
  CoreML::validate<(MLModelType)500>((Result *)local_f8,(Model *)&output_channels);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_f8);
  if (m1._oneof_case_[0]._0_1_) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8ab);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((res).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_f8);
  CoreML::Specification::Model::~Model((Model *)&output_channels);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidConvolution3DNonPositiveKernelSize() {
    Specification::Model m1;

    int input_channels = 3;
    int output_channels = 3;
    int kernel_depth = 3;
    int kernel_height = 0;
    int kernel_width = 3;
    int nGroups = 1;
    int stride_depth = 1;
    int stride_height = 1;
    int stride_width = 1;
    int dilation_depth = 1;
    int dilation_height = 1;
    int dilation_width = 1;
    int pad_front = 0;
    int pad_back = 0;
    int pad_top = 0;
    int pad_bottom = 0;
    int pad_left = 0;
    int pad_right = 0;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(3);
    shape->add_shape(32);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution3d();
    params->set_inputchannels(input_channels);
    params->set_outputchannels(output_channels);
    params->set_kerneldepth(kernel_depth);
    params->set_kernelheight(kernel_height);
    params->set_kernelwidth(kernel_width);
    params->set_ngroups(nGroups);
    params->set_stridedepth(stride_depth);
    params->set_strideheight(stride_height);
    params->set_stridewidth(stride_width);
    params->set_dilationdepth(dilation_depth);
    params->set_dilationheight(dilation_height);
    params->set_dilationwidth(dilation_width);
    params->set_paddingtype(CoreML::Specification::Convolution3DLayerParams_PaddingType_CUSTOM);
    params->set_custompaddingfront(pad_front);
    params->set_custompaddingback(pad_back);
    params->set_custompaddingtop(pad_top);
    params->set_custompaddingbottom(pad_bottom);
    params->set_custompaddingleft(pad_left);
    params->set_custompaddingright(pad_right);

    params->set_hasbias(true);

    // Fill weights
    for (int i = 0; i < output_channels * (input_channels / nGroups) * kernel_depth * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Fill bias
    for (int i = 0; i < output_channels; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}